

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void __thiscall
cpptrace::detail::panic(detail *this,char *signature,source_location location,string *message)

{
  bool bVar1;
  internal_error *piVar2;
  char *local_40 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *message_local;
  char *signature_local;
  source_location location_local;
  
  local_28 = location._8_8_;
  location_local.file._0_4_ = location.file._0_4_;
  message_local = (string *)this;
  signature_local = signature;
  bVar1 = std::operator==(local_28,"");
  if (!bVar1) {
    piVar2 = (internal_error *)__cxa_allocate_exception(0x28);
    local_40[0] = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str(local_28);
    internal_error::internal_error<char_const*const&,int_const&,char_const*&,char_const*>
              (piVar2,"Cpptrace panic {}:{}: {}: {}\n",&signature_local,(int *)&location_local,
               (char **)&message_local,local_40);
    __cxa_throw(piVar2,&internal_error::typeinfo,internal_error::~internal_error);
  }
  piVar2 = (internal_error *)__cxa_allocate_exception(0x28);
  internal_error::internal_error<char_const*const&,int_const&,char_const*&>
            (piVar2,"Cpptrace panic {}:{}: {}\n",&signature_local,(int *)&location_local,
             (char **)&message_local);
  __cxa_throw(piVar2,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

[[noreturn]] inline void panic(
        const char* signature,
        source_location location,
        const std::string& message = ""
    ) {
        if(message == "") {
            throw internal_error(
                "Cpptrace panic {}:{}: {}\n",
                location.file, location.line, signature
            );
        } else {
            throw internal_error(
                "Cpptrace panic {}:{}: {}: {}\n",
                location.file, location.line, signature, message.c_str()
            );
        }
    }